

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.h
# Opt level: O0

void __thiscall
slang::ast::SequenceWithMatchExpr::visitExprs<slang::ast::builtins::MonitorVisitor&>
          (SequenceWithMatchExpr *this,MonitorVisitor *visitor)

{
  iterator ppEVar1;
  Expression *item;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range3;
  MonitorVisitor *visitor_local;
  SequenceWithMatchExpr *this_local;
  
  AssertionExpr::visit<slang::ast::builtins::MonitorVisitor>(this->expr,visitor);
  __end3 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
           begin(&this->matchItems);
  ppEVar1 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
            end(&this->matchItems);
  for (; __end3 != ppEVar1; __end3 = __end3 + 1) {
    Expression::visit<slang::ast::builtins::MonitorVisitor&>(*__end3,visitor);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        expr.visit(visitor);
        for (auto item : matchItems)
            item->visit(visitor);
    }